

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.cpp
# Opt level: O1

void helics::processOptions
               (value *section,
               function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *optionConversion,
               function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *valueConversion,function<void_(int,_int)> *optionAction)

{
  basic_value<toml::type_config> *this;
  _Hash_node_base *p_Var1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  table_type *ptVar4;
  boolean_type *pbVar5;
  uint *puVar6;
  string_type *psVar7;
  undefined8 local_38;
  
  local_38 = in_RAX;
  ptVar4 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(section);
  p_Var1 = (ptVar4->_M_h)._M_before_begin._M_nxt;
  do {
    if (p_Var1 == (_Hash_node_base *)0x0) {
      return;
    }
    if (1 < (byte)(*(char *)&p_Var1[5]._M_nxt - 9U)) {
      if ((optionConversion->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0039b21c:
        std::__throw_bad_function_call();
      }
      iVar2 = (*optionConversion->_M_invoker)
                        ((_Any_data *)optionConversion,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var1 + 1));
      if (-1 < iVar2) {
        this = (basic_value<toml::type_config> *)(p_Var1 + 5);
        if (this->type_ == integer) {
          puVar6 = (uint *)toml::basic_value<toml::type_config>::as_integer(this);
          uVar3 = *puVar6;
        }
        else if (this->type_ == boolean) {
          pbVar5 = toml::basic_value<toml::type_config>::as_boolean(this);
          uVar3 = (uint)*pbVar5;
        }
        else {
          psVar7 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(this);
          if ((valueConversion->super__Function_base)._M_manager == (_Manager_type)0x0)
          goto LAB_0039b21c;
          uVar3 = (*valueConversion->_M_invoker)((_Any_data *)valueConversion,psVar7);
        }
        local_38 = CONCAT44(iVar2,uVar3);
        if ((optionAction->super__Function_base)._M_manager == (_Manager_type)0x0)
        goto LAB_0039b21c;
        (*optionAction->_M_invoker)
                  ((_Any_data *)optionAction,(int *)((long)&local_38 + 4),(int *)&local_38);
      }
    }
    p_Var1 = p_Var1->_M_nxt;
  } while( true );
}

Assistant:

void processOptions(const toml::value& section,
                    const std::function<int(const std::string&)>& optionConversion,
                    const std::function<int(const std::string&)>& valueConversion,
                    const std::function<void(int, int)>& optionAction)
{
    const auto& table = section.as_table();
    for (const auto& telement : table) {
        if (telement.second.is_array() || telement.second.is_table()) {
            continue;
        }
        const int32_t index = optionConversion(telement.first);
        if (index >= 0) {
            int32_t val = -1;
            if (telement.second.is_boolean()) {
                val = telement.second.as_boolean() ? 1 : 0;
            } else if (telement.second.is_integer()) {
                val = telement.second.as_integer();
            } else {
                val = valueConversion(telement.second.as_string());
            }
            optionAction(index, val);
        }
    }
}